

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::EnumType::EnumType
          (EnumType *this,Compilation *compilation,SourceLocation loc,Type *baseType_,
          ASTContext *context)

{
  string_view name;
  bool bVar1;
  bitwidth_t bVar2;
  int iVar3;
  char *in_RCX;
  Type *in_RDX;
  Compilation *in_RSI;
  long in_RDI;
  size_t in_R8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffa0;
  SymbolIndex in_stack_ffffffffffffffa4;
  Compilation *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  IntegralType *in_stack_ffffffffffffffc8;
  SourceLocation in_stack_ffffffffffffffd0;
  Type *this_00;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8);
  this_00 = in_RDX;
  bVar2 = Type::getBitWidth((Type *)in_stack_ffffffffffffffa8);
  bVar1 = Type::isSigned((Type *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb0);
  bVar1 = Type::isFourState(this_00);
  uVar4 = (uint)bVar1;
  name._M_str = in_RCX;
  name._M_len = in_R8;
  IntegralType::IntegralType
            (in_stack_ffffffffffffffc8,(SymbolKind)((ulong)in_RDX >> 0x20),name,
             in_stack_ffffffffffffffd0,(bitwidth_t)in_RDX,SUB81((ulong)in_RDI >> 0x38,0),
             SUB81((ulong)in_RDI >> 0x30,0));
  Scope::Scope((Scope *)CONCAT44(bVar2,uVar5),in_stack_ffffffffffffffa8,
               (Symbol *)CONCAT44(in_stack_ffffffffffffffa4,uVar4));
  *(char **)(in_RDI + 0x88) = in_RCX;
  iVar3 = Compilation::getNextEnumSystemId(in_RSI);
  *(int *)(in_RDI + 0x90) = iVar3;
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x4ceab0);
  Symbol::setParent((Symbol *)CONCAT44(bVar2,uVar5),(Scope *)in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa4);
  return;
}

Assistant:

EnumType::EnumType(Compilation& compilation, SourceLocation loc, const Type& baseType_,
                   const ASTContext& context) :
    IntegralType(SymbolKind::EnumType, "", loc, baseType_.getBitWidth(), baseType_.isSigned(),
                 baseType_.isFourState()),
    Scope(compilation, this), baseType(baseType_), systemId(compilation.getNextEnumSystemId()) {

    // Enum types don't live as members of the parent scope (they're "owned" by the declaration
    // containing them) but we hook up the parent pointer so that it can participate in name
    // lookups.
    setParent(*context.scope, context.lookupIndex);
}